

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void group_gain(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  CHAR_DATA *pCVar5;
  ROOM_INDEX_DATA *pRVar6;
  char *pcVar7;
  CHAR_DATA *pCVar8;
  ulong uVar9;
  char *__format;
  char *pcVar10;
  int iVar11;
  char buf [4608];
  int local_124c;
  char local_1238 [4616];
  
  if (victim != ch) {
    bVar1 = is_npc(victim);
    pRVar6 = ch->in_room;
    pCVar8 = pRVar6->people;
    if (pCVar8 == (CHAR_DATA *)0x0) {
      pCVar8 = ch->leader;
      if (ch->leader == (CHAR_DATA *)0x0) {
        pCVar8 = ch;
      }
      local_124c = 0;
      iVar11 = 1;
    }
    else {
      local_124c = 0;
      iVar11 = 0;
      do {
        bVar2 = is_same_group(pCVar8,ch);
        if (bVar2) {
          bVar2 = is_npc(pCVar8);
          if ((!bVar2) || (pCVar5 = pCVar8->master, pCVar8->master == (CHAR_DATA *)0x0)) {
            pCVar5 = pCVar8;
          }
          iVar11 = iVar11 + 1;
          local_124c = local_124c + pCVar5->level;
        }
        pCVar8 = pCVar8->next_in_room;
      } while (pCVar8 != (CHAR_DATA *)0x0);
      pRVar6 = ch->in_room;
      iVar11 = iVar11 + (uint)(iVar11 == 0);
      pCVar8 = ch->leader;
      if (ch->leader == (CHAR_DATA *)0x0) {
        pCVar8 = ch;
      }
      if (pRVar6 == (ROOM_INDEX_DATA *)0x0) {
        return;
      }
    }
    for (pCVar5 = pRVar6->people; pCVar5 != (CHAR_DATA *)0x0; pCVar5 = pCVar5->next_in_room) {
      bVar2 = is_same_group(pCVar5,ch);
      if (bVar2) {
        iVar3 = (int)pCVar5->level - (int)pCVar8->level;
        if (iVar3 < 9) {
          if (-9 < iVar3) {
            if (bVar1) {
              uVar4 = xp_compute(pCVar5,victim,iVar11,local_124c);
            }
            else {
              uVar4 = xp_compute_pk(pCVar5,victim,iVar11);
            }
            uVar9 = 0;
            if (0 < (int)uVar4) {
              uVar9 = (ulong)uVar4;
            }
            if (pCVar5->level < 0x33) {
              pcVar10 = get_char_color(pCVar5,"white");
              pcVar7 = END_COLOR(pCVar5);
              if ((int)uVar4 < 1) {
                __format = "%sYou receive no experience from this victory.%s\n\r";
                goto LAB_00291fe7;
              }
              sprintf(local_1238,"%sYou receive %d experience points.%s\n\r",pcVar10,uVar9,pcVar7);
            }
            else {
              pcVar10 = get_char_color(pCVar5,"white");
              pcVar7 = END_COLOR(pCVar5);
              __format = "%sYou have already reached the pinnacle of your learning.%s\n\r";
LAB_00291fe7:
              sprintf(local_1238,__format,pcVar10,pcVar7);
            }
            send_to_char(local_1238,pCVar5);
            gain_exp(pCVar5,(int)uVar9);
            goto LAB_00292013;
          }
          pcVar10 = "You are too low for this group.\n\r";
        }
        else {
          pcVar10 = "You are too high for this group.\n\r";
        }
        send_to_char(pcVar10,pCVar5);
      }
LAB_00292013:
    }
  }
  return;
}

Assistant:

void group_gain(CHAR_DATA *ch, CHAR_DATA *victim)
{
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *gch;
	CHAR_DATA *lch;
	int xp;
	int members;
	int group_levels;
	bool ispk = false;

	/*
	 * Monsters don't get kill xp's or alignment changes.
	 * P-killing doesn't help either.
	 * Dying of mortal wounds or poison doesn't give xp to anyone!
	 */

	if (victim == ch)
		return;

	if (!is_npc(victim))
		ispk = true;

	members = 0;
	group_levels = 0;

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (is_same_group(gch, ch))
		{
			// if(!is_npc(gch))
			members++;
			group_levels += (is_npc(gch) && gch->master) ? gch->master->level : gch->level;
			// note: the preceding code skews the group average a bit in favor of the group leader if there's npcs in
			// the group but i don't really care
		}
	}

	if (members == 0)
		members = 1;

	lch = (ch->leader != nullptr) ? ch->leader : ch;

	if (ch->in_room == nullptr)
		return;

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (!is_same_group(gch, ch)) // || is_npc(gch))
			continue;

		if (gch->level - lch->level > 8)
		{
			send_to_char("You are too high for this group.\n\r", gch);
			continue;
		}

		if (gch->level - lch->level < -8)
		{
			send_to_char("You are too low for this group.\n\r", gch);
			continue;
		}

		if (!ispk)
			xp = xp_compute(gch, victim, members, group_levels);
		else
			xp = xp_compute_pk(gch, victim, members);

		if (xp < 0)
			xp = 0;

		if (gch->level < 51)
		{
			if (xp > 0)
				sprintf(buf, "%sYou receive %d experience points.%s\n\r", get_char_color(gch, "white"), xp, END_COLOR(gch));
			else
				sprintf(buf, "%sYou receive no experience from this victory.%s\n\r", get_char_color(gch, "white"), END_COLOR(gch));
		}
		else
		{
			sprintf(buf, "%sYou have already reached the pinnacle of your learning.%s\n\r", get_char_color(gch, "white"), END_COLOR(gch));
		}

		send_to_char(buf, gch);
		gain_exp(gch, xp);
	}
}